

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_variable.cpp
# Opt level: O2

void __thiscall DFsVariable::GetValue(DFsVariable *this,svalue_t *returnvar)

{
  int iVar1;
  anon_union_8_3_837bfa25_for_value aVar2;
  
  switch(this->type) {
  case 0:
    returnvar->type = 0;
    FString::operator=(&returnvar->string,&this->string);
    return;
  default:
    returnvar->type = this->type;
    iVar1 = (this->value).i;
    break;
  case 2:
    returnvar->type = 2;
    aVar2.mobj = GC::ReadBarrier<AActor>((AActor **)&this->actor);
    goto LAB_005eff46;
  case 7:
    returnvar->type = 1;
    iVar1 = *(this->value).pI;
    break;
  case 8:
    returnvar->type = 2;
    aVar2 = *(anon_union_8_3_837bfa25_for_value *)(this->value).pMobj;
LAB_005eff46:
    returnvar->value = aVar2;
    return;
  case 9:
    returnvar->type = 1;
    iVar1 = ((this->value).ls)->number;
  }
  (returnvar->value).i = iVar1;
  return;
}

Assistant:

void DFsVariable::GetValue(svalue_t &returnvar)
{
	switch (type)
	{
	case svt_pInt:
		returnvar.type = svt_int;
		returnvar.value.i = *value.pI;
		break;

	case svt_pMobj:
		returnvar.type = svt_mobj;
		returnvar.value.mobj = *value.pMobj;
		break;

	case svt_mobj:
		returnvar.type = type;
		returnvar.value.mobj = actor;
		break;

	case svt_linespec:
		returnvar.type = svt_int;
		returnvar.value.i = value.ls->number;
		break;

	case svt_string:
		returnvar.type = type;
		returnvar.string = string;
		break;

	default:
		// copy the value (also handles fixed)
		returnvar.type = type;
		returnvar.value.i = value.i;
		break;
    }
}